

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Float FVar8;
  float fVar9;
  undefined8 in_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM2_Qb;
  undefined1 in_XMM4 [16];
  Vector3f wm;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar12 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_28 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_24 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_20 = (float)in_XMM0_Qb;
  fStack_1c = (float)((ulong)in_XMM0_Qb >> 0x20);
  fVar9 = 0.0;
  local_38 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_34 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_30 = (float)in_XMM2_Qb;
  fStack_2c = (float)((ulong)in_XMM2_Qb >> 0x20);
  if ((sampleFlags & Reflection) != Unset) {
    if (0.0 < fVar12 * wi.super_Tuple3<pbrt::Vector3,_float>.z) {
      auVar10 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                           ZEXT416((uint)(this->mfDistrib).alpha_x));
      fVar9 = 0.0;
      if (0.001 <= auVar10._0_4_) {
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar7 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg,CONCAT44(in_register_00000034,mode));
          if (iVar7 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        *(long *)(in_FS_OFFSET + -0x40) = *(long *)(in_FS_OFFSET + -0x40) + 1;
        local_38 = local_38 + local_28;
        fStack_34 = fStack_34 + fStack_24;
        fStack_30 = fStack_30 + fStack_20;
        fStack_2c = fStack_2c + fStack_1c;
        fVar1 = wi.super_Tuple3<pbrt::Vector3,_float>.z + fVar12;
        auVar10._0_4_ = local_38 * local_38;
        auVar10._4_4_ = fStack_34 * fStack_34;
        auVar10._8_4_ = fStack_30 * fStack_30;
        auVar10._12_4_ = fStack_2c * fStack_2c;
        auVar10 = vhaddps_avx(auVar10,auVar10);
        fVar2 = fVar1 * fVar1 + auVar10._0_4_;
        if ((fVar2 == 0.0) && (!NAN(fVar2))) {
          *(long *)(in_FS_OFFSET + -0x48) = *(long *)(in_FS_OFFSET + -0x48) + 1;
        }
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar7 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg);
          if (iVar7 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        auVar5._8_4_ = fStack_20;
        auVar5._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar5._12_4_ = fStack_1c;
        auVar3._4_4_ = fStack_34;
        auVar3._0_4_ = local_38;
        auVar3._8_4_ = fStack_30;
        auVar3._12_4_ = fStack_2c;
        *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + 1;
        auVar11._0_4_ = local_38 * local_28;
        auVar11._4_4_ = fStack_34 * fStack_24;
        auVar11._8_4_ = fStack_30 * fStack_20;
        auVar11._12_4_ = fStack_2c * fStack_1c;
        auVar10 = vmovshdup_avx(auVar11);
        fVar9 = 0.0;
        auVar10 = vfmadd231ss_fma(auVar10,auVar5,auVar3);
        auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),ZEXT416((uint)fVar12));
        if (auVar10._0_4_ < 0.0) {
          *(long *)(in_FS_OFFSET + -0x38) = *(long *)(in_FS_OFFSET + -0x38) + 1;
        }
        if (((fVar2 != 0.0) || (NAN(fVar2))) && (0.0 < auVar10._0_4_)) {
          auVar10 = vsqrtss_avx(in_XMM4,ZEXT416((uint)fVar2));
          auVar4._4_4_ = fStack_34;
          auVar4._0_4_ = local_38;
          auVar4._8_4_ = fStack_30;
          auVar4._12_4_ = fStack_2c;
          fVar9 = auVar10._0_4_;
          auVar13._4_4_ = fVar9;
          auVar13._0_4_ = fVar9;
          auVar13._8_4_ = fVar9;
          auVar13._12_4_ = fVar9;
          wm.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 / fVar9;
          auVar10 = vdivps_avx(auVar4,auVar13);
          wm.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar10._0_8_;
          FVar8 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm);
          auVar6._8_4_ = fStack_20;
          auVar6._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar6._12_4_ = fStack_1c;
          auVar14._0_4_ = auVar10._0_4_ * local_28;
          auVar14._4_4_ = auVar10._4_4_ * fStack_24;
          auVar14._8_4_ = auVar10._8_4_ * fStack_20;
          auVar14._12_4_ = auVar10._12_4_ * fStack_1c;
          auVar3 = vmovshdup_avx(auVar14);
          auVar10 = vfmadd231ss_fma(auVar3,auVar10,auVar6);
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)wm.super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)fVar12));
          fVar9 = FVar8 / (auVar10._0_4_ * 4.0);
        }
      }
    }
  }
  return fVar9;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySmooth())
            return 0;
        // Return PDF for sampling Torrance--Sparrow conductor BRDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }